

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O2

void xxHash32_test(void *key,int len,uint32_t seed,void *out)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  if ((uint)len < 0x10) {
    uVar5 = seed + 0x165667b1 + len;
    switch(len & 0xf) {
    case 0:
      goto switchD_0010831f_caseD_0;
    case 2:
      goto switchD_0010831f_caseD_2;
    case 3:
      goto switchD_0010831f_caseD_3;
    case 4:
      goto switchD_0010831f_caseD_4;
    case 5:
      goto switchD_0010831f_caseD_5;
    case 6:
      goto switchD_0010831f_caseD_6;
    case 7:
      goto switchD_0010831f_caseD_7;
    case 8:
      goto switchD_0010831f_caseD_8;
    case 9:
      goto switchD_0010831f_caseD_9;
    case 10:
      goto switchD_0010831f_caseD_a;
    case 0xb:
      goto switchD_0010831f_caseD_b;
    case 0xc:
      goto switchD_0010831f_caseD_c;
    case 0xd:
      goto switchD_0010831f_caseD_d;
    case 0xe:
      goto switchD_0010831f_caseD_e;
    case 0xf:
      goto switchD_0010831f_caseD_f;
    }
  }
  else {
    uVar7 = seed + 0x24234428;
    uVar9 = seed + 0x85ebca77;
    uVar5 = seed + 0x61c8864f;
    pbVar2 = (byte *)((long)key + (long)len + -0xf);
    do {
      uVar7 = *key * -0x7a143589 + uVar7;
      uVar8 = uVar7 >> 0x13 | uVar7 * 0x2000;
      uVar7 = uVar8 * -0x61c8864f;
      uVar9 = *(int *)((long)key + 4) * -0x7a143589 + uVar9;
      uVar10 = uVar9 >> 0x13 | uVar9 * 0x2000;
      uVar9 = uVar10 * -0x61c8864f;
      uVar11 = *(int *)((long)key + 8) * -0x7a143589 + seed;
      uVar11 = uVar11 >> 0x13 | uVar11 * 0x2000;
      pbVar1 = (byte *)((long)key + 0xc);
      key = (void *)((long)key + 0x10);
      seed = uVar11 * -0x61c8864f;
      uVar5 = *(int *)pbVar1 * -0x7a143589 + uVar5;
      uVar6 = uVar5 >> 0x13 | uVar5 * 0x2000;
      uVar5 = uVar6 * -0x61c8864f;
    } while (key < pbVar2);
    uVar5 = (uVar5 >> 0xe | uVar6 * -0x193c0000) + (seed >> 0x14 | uVar11 * 0x779b1000) +
            (uVar9 >> 0x19 | uVar10 * 0x1bbcd880) + (uVar7 >> 0x1f | uVar8 * 0x3c6ef362) + len;
    switch(len & 0xf) {
    case 0:
      goto switchD_0010831f_caseD_0;
    case 1:
      break;
    case 3:
switchD_0010831f_caseD_3:
      bVar3 = *key;
      key = (void *)((long)key + 1);
      uVar5 = (uint)bVar3 * 0x165667b1 + uVar5;
      uVar5 = (uVar5 >> 0x15 | uVar5 * 0x800) * -0x61c8864f;
    case 2:
switchD_0010831f_caseD_2:
      bVar3 = *key;
      key = (void *)((long)key + 1);
      uVar5 = (uint)bVar3 * 0x165667b1 + uVar5;
      uVar5 = (uVar5 >> 0x15 | uVar5 * 0x800) * -0x61c8864f;
      break;
    case 4:
      goto switchD_0010831f_caseD_4;
    case 5:
      goto switchD_0010831f_caseD_5;
    case 6:
      goto switchD_0010831f_caseD_6;
    case 7:
      goto switchD_0010831f_caseD_7;
    case 0xc:
switchD_0010831f_caseD_c:
      iVar4 = *key;
      key = (void *)((long)key + 4);
      uVar5 = iVar4 * -0x3d4d51c3 + uVar5;
      uVar5 = (uVar5 >> 0xf | uVar5 * 0x20000) * 0x27d4eb2f;
    case 8:
switchD_0010831f_caseD_8:
      iVar4 = *key;
      key = (void *)((long)key + 4);
      uVar5 = iVar4 * -0x3d4d51c3 + uVar5;
      uVar5 = (uVar5 >> 0xf | uVar5 * 0x20000) * 0x27d4eb2f;
      goto switchD_0010831f_caseD_4;
    case 0xd:
switchD_0010831f_caseD_d:
      iVar4 = *key;
      key = (void *)((long)key + 4);
      uVar5 = iVar4 * -0x3d4d51c3 + uVar5;
      uVar5 = (uVar5 >> 0xf | uVar5 * 0x20000) * 0x27d4eb2f;
    case 9:
switchD_0010831f_caseD_9:
      iVar4 = *key;
      key = (void *)((long)key + 4);
      uVar5 = iVar4 * -0x3d4d51c3 + uVar5;
      uVar5 = (uVar5 >> 0xf | uVar5 * 0x20000) * 0x27d4eb2f;
      goto switchD_0010831f_caseD_5;
    case 0xe:
switchD_0010831f_caseD_e:
      iVar4 = *key;
      key = (void *)((long)key + 4);
      uVar5 = iVar4 * -0x3d4d51c3 + uVar5;
      uVar5 = (uVar5 >> 0xf | uVar5 * 0x20000) * 0x27d4eb2f;
    case 10:
switchD_0010831f_caseD_a:
      iVar4 = *key;
      key = (void *)((long)key + 4);
      uVar5 = iVar4 * -0x3d4d51c3 + uVar5;
      uVar5 = (uVar5 >> 0xf | uVar5 * 0x20000) * 0x27d4eb2f;
      goto switchD_0010831f_caseD_6;
    case 0xf:
switchD_0010831f_caseD_f:
      iVar4 = *key;
      key = (void *)((long)key + 4);
      uVar5 = iVar4 * -0x3d4d51c3 + uVar5;
      uVar5 = (uVar5 >> 0xf | uVar5 * 0x20000) * 0x27d4eb2f;
    case 0xb:
switchD_0010831f_caseD_b:
      iVar4 = *key;
      key = (void *)((long)key + 4);
      uVar5 = iVar4 * -0x3d4d51c3 + uVar5;
      uVar5 = (uVar5 >> 0xf | uVar5 * 0x20000) * 0x27d4eb2f;
      goto switchD_0010831f_caseD_7;
    }
  }
  uVar5 = (uint)*key * 0x165667b1 + uVar5;
  uVar5 = uVar5 >> 0x15 | uVar5 * 0x800;
  goto LAB_001084cf;
switchD_0010831f_caseD_7:
  iVar4 = *key;
  key = (void *)((long)key + 4);
  uVar5 = iVar4 * -0x3d4d51c3 + uVar5;
  uVar5 = (uVar5 >> 0xf | uVar5 * 0x20000) * 0x27d4eb2f;
  goto switchD_0010831f_caseD_3;
switchD_0010831f_caseD_6:
  uVar5 = *key * -0x3d4d51c3 + uVar5;
  uVar5 = (uint)*(byte *)((long)key + 4) * 0x165667b1 +
          (uVar5 >> 0xf | uVar5 * 0x20000) * 0x27d4eb2f;
  bVar3 = *(byte *)((long)key + 5);
  iVar4 = (uVar5 >> 0x15 | uVar5 * 0x800) * -0x61c8864f;
  goto LAB_001084c1;
switchD_0010831f_caseD_5:
  uVar5 = *key * -0x3d4d51c3 + uVar5;
  bVar3 = *(byte *)((long)key + 4);
  iVar4 = (uVar5 >> 0xf | uVar5 * 0x20000) * 0x27d4eb2f;
LAB_001084c1:
  uVar5 = (uint)bVar3 * 0x165667b1 + iVar4;
  uVar5 = uVar5 >> 0x15 | uVar5 * 0x800;
LAB_001084cf:
  uVar5 = uVar5 * -0x61c8864f;
  goto switchD_0010831f_caseD_0;
switchD_0010831f_caseD_4:
  uVar5 = *key * -0x3d4d51c3 + uVar5;
  uVar5 = (uVar5 >> 0xf | uVar5 * 0x20000) * 0x27d4eb2f;
switchD_0010831f_caseD_0:
  uVar5 = (uVar5 >> 0xf ^ uVar5) * -0x7a143589;
  uVar5 = (uVar5 >> 0xd ^ uVar5) * -0x3d4d51c3;
  *(uint *)out = uVar5 >> 0x10 ^ uVar5;
  return;
}

Assistant:

XXH_FORCE_INLINE U32
XXH32_endian_align(const void* input, size_t len, U32 seed, XXH_alignment align)
{
    const BYTE* p = (const BYTE*)input;
    const BYTE* bEnd = p + len;
    U32 h32;

#if defined(XXH_ACCEPT_NULL_INPUT_POINTER) && (XXH_ACCEPT_NULL_INPUT_POINTER>=1)
    if (p==NULL) {
        len=0;
        bEnd=p=(const BYTE*)(size_t)16;
    }
#endif

    if (len>=16) {
        const BYTE* const limit = bEnd - 15;
        U32 v1 = seed + PRIME32_1 + PRIME32_2;
        U32 v2 = seed + PRIME32_2;
        U32 v3 = seed + 0;
        U32 v4 = seed - PRIME32_1;

        do {
            v1 = XXH32_round(v1, XXH_get32bits(p)); p+=4;
            v2 = XXH32_round(v2, XXH_get32bits(p)); p+=4;
            v3 = XXH32_round(v3, XXH_get32bits(p)); p+=4;
            v4 = XXH32_round(v4, XXH_get32bits(p)); p+=4;
        } while (p < limit);

        h32 = XXH_rotl32(v1, 1)  + XXH_rotl32(v2, 7)
            + XXH_rotl32(v3, 12) + XXH_rotl32(v4, 18);
    } else {
        h32  = seed + PRIME32_5;
    }

    h32 += (U32)len;

    return XXH32_finalize(h32, p, len&15, align);
}